

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fw_data_parser.c
# Opt level: O3

int image_fwdata_get_version2(igsc_fwdata_image *img,igsc_fwdata_version2 *version)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  long in_FS_OFFSET;
  char __time_buf [128];
  char local_98 [128];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = (int *)(img->layout).table[0].content;
  iVar3 = 0;
  if (*piVar2 == 0x401) {
    uVar6 = 1;
    uVar7 = 0;
  }
  else {
    if (*piVar2 != 0x402) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_98,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Bad version format %u\n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/fw_data_parser.c"
               ,"image_fwdata_get_version2",0x4c,*piVar2);
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(local_98,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad version format %u\n",pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/fw_data_parser.c"
                  ,"image_fwdata_get_version2",0x4c,*piVar2);
      }
      iVar3 = 5;
      goto LAB_0011bfba;
    }
    uVar7 = piVar2[4];
    uVar6 = 2;
  }
  version->data_arb_svn = uVar7;
  version->format_version = uVar6;
  version->flags = 0;
  version->data_arb_svn_fitb = 0;
  version->oem_manuf_data_version = piVar2[1];
  version->oem_manuf_data_version_fitb = 0;
  iVar1 = piVar2[2];
  version->major_version = (short)iVar1;
  version->major_vcn = (short)((uint)iVar1 >> 0x10);
LAB_0011bfba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int image_fwdata_get_version2(struct igsc_fwdata_image* img,
                              struct igsc_fwdata_version2* version)
{
    struct gsc_fwu_heci_image_metadata* metadata = (struct gsc_fwu_heci_image_metadata*)img->layout.table[FWU_FPT_ENTRY_IMAGE_INFO].content;
    struct igsc_fwdata_metadata* meta = (struct igsc_fwdata_metadata*)&metadata->metadata;

    switch (metadata->metadata_format_version)
    {
    case FWU_GSC_HECI_METADATA_DATA_UPDATE_VERSION_1:
        version->data_arb_svn = 0;
        version->format_version = IGSC_FWDATA_FORMAT_VERSION_1;
        break;
    case FWU_GSC_HECI_METADATA_DATA_UPDATE_VERSION_2:
        version->data_arb_svn = meta->data_arb_svn;
        version->format_version = IGSC_FWDATA_FORMAT_VERSION_2;
        break;
    default:
        gsc_error("Bad version format %u\n", metadata->metadata_format_version);
        return IGSC_ERROR_BAD_IMAGE;
    }
    version->flags = 0;
    version->data_arb_svn_fitb = 0;
    version->oem_manuf_data_version = meta->oem_manuf_data_version;
    version->oem_manuf_data_version_fitb = 0;
    version->major_vcn = meta->major_vcn;
    version->major_version = meta->major_fw_version;

    return IGSC_SUCCESS;
}